

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void __thiscall ImRect::Add(ImRect *this,ImRect *r)

{
  float *pfVar1;
  float fVar2;
  
  fVar2 = (r->Min).x;
  if (fVar2 < (this->Min).x) {
    (this->Min).x = fVar2;
  }
  fVar2 = (r->Min).y;
  if (fVar2 < (this->Min).y) {
    (this->Min).y = fVar2;
  }
  fVar2 = (r->Max).x;
  if ((this->Max).x <= fVar2 && fVar2 != (this->Max).x) {
    (this->Max).x = fVar2;
  }
  fVar2 = (r->Max).y;
  pfVar1 = &(this->Max).y;
  if (*pfVar1 <= fVar2 && fVar2 != *pfVar1) {
    (this->Max).y = fVar2;
  }
  return;
}

Assistant:

void        Add(const ImRect& r)                { if (Min.x > r.Min.x) Min.x = r.Min.x; if (Min.y > r.Min.y) Min.y = r.Min.y; if (Max.x < r.Max.x) Max.x = r.Max.x; if (Max.y < r.Max.y) Max.y = r.Max.y; }